

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcProjectionCurve::~IfcProjectionCurve(IfcProjectionCurve *this)

{
  ~IfcProjectionCurve((IfcProjectionCurve *)
                      &this[-1].super_IfcAnnotationCurveOccurrence.super_IfcAnnotationOccurrence.
                       super_IfcStyledItem.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x18);
  return;
}

Assistant:

IfcProjectionCurve() : Object("IfcProjectionCurve") {}